

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

format_decimal_result<char_*>
fmt::v8::detail::format_decimal<char,unsigned_long>(char *out,unsigned_long value,int size)

{
  bool bVar1;
  char *pcVar2;
  ulong uVar3;
  char *pcVar4;
  format_decimal_result<char_*> fVar5;
  
  pcVar2 = out + size;
  uVar3 = value;
  pcVar4 = pcVar2;
  if (99 < value) {
    do {
      value = uVar3 / 100;
      *(undefined2 *)(pcVar4 + -2) =
           *(undefined2 *)
            (
            "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            + (uVar3 % 100) * 2);
      pcVar4 = pcVar4 + -2;
      bVar1 = 9999 < uVar3;
      uVar3 = value;
    } while (bVar1);
  }
  if (value < 10) {
    pcVar4[-1] = (byte)value | 0x30;
    pcVar4 = pcVar4 + -1;
  }
  else {
    *(undefined2 *)(pcVar4 + -2) =
         *(undefined2 *)
          (
          "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
          + value * 2);
    pcVar4 = pcVar4 + -2;
  }
  fVar5.end = pcVar2;
  fVar5.begin = pcVar4;
  return fVar5;
}

Assistant:

FMT_CONSTEXPR20 auto format_decimal(Char* out, UInt value, int size)
    -> format_decimal_result<Char*> {
  FMT_ASSERT(size >= count_digits(value), "invalid digit count");
  out += size;
  Char* end = out;
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    out -= 2;
    copy2(out, digits2(static_cast<size_t>(value % 100)));
    value /= 100;
  }
  if (value < 10) {
    *--out = static_cast<Char>('0' + value);
    return {out, end};
  }
  out -= 2;
  copy2(out, digits2(static_cast<size_t>(value)));
  return {out, end};
}